

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereSurface.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  string fileName;
  ofstream outfile;
  stringstream ss;
  double local_460;
  ulong *local_458;
  long local_450;
  ulong local_448;
  long lStack_440;
  ulong *local_438;
  long local_430;
  ulong local_428 [2];
  long *local_418;
  long local_410;
  long local_408;
  long lStack_400;
  long *local_3f8;
  long local_3f0;
  long local_3e8;
  long lStack_3e0;
  string local_3d8;
  undefined1 local_3b8 [8];
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [14];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  long local_1a8;
  undefined8 local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  iVar3 = 1;
  local_460 = 0.5;
  while( true ) {
    while (iVar2 = getopt(argc,argv,"r:p:"), iVar2 == 0x70) {
      iVar3 = atoi(_optarg);
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x3f) {
      if (_optopt == 99) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Option -",8);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_optopt);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," requires an argument.",0x16);
        lVar9 = *(long *)poVar4;
      }
      else {
        iVar3 = isprint(_optopt);
        if (iVar3 == 0) {
          pcVar10 = "Unknown option character ";
          lVar9 = 0x19;
        }
        else {
          pcVar10 = "Unknown option -";
          lVar9 = 0x10;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar9);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_optopt);
        lVar9 = *(long *)poVar4;
      }
      std::ios::widen((char)*(undefined8 *)(lVar9 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      return 1;
    }
    if (iVar2 != 0x72) {
      abort();
    }
    local_460 = strtod(_optarg,(char **)0x0);
  }
  switch(iVar3) {
  case 0:
    argv = (char **)operator_new(0xb0);
    Rectangular::Rectangular((Rectangular *)argv,local_460);
    break;
  case 1:
    argv = (char **)operator_new(0xf0);
    Spherical::Spherical((Spherical *)argv,local_460);
    break;
  case 2:
    argv = (char **)operator_new(0xb0);
    BoxProjection::BoxProjection((BoxProjection *)argv,local_460);
    break;
  case 3:
    argv = (char **)operator_new(0xf0);
    YinYang::YinYang((YinYang *)argv,local_460);
    break;
  case 4:
    argv = (char **)operator_new(0x138);
    TwoCaps::TwoCaps((TwoCaps *)argv,local_460);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>> Starting SphereSurface <<<\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sphere Radius = ",0x10);
  poVar4 = std::ostream::_M_insert<double>((((TwoCaps *)argv)->super_Parameterization).radius);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Using Parameterization = ",0x19);
  Parameterization::GetName_abi_cxx11_((string *)local_3b8,(Parameterization *)argv);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_3b8,local_3b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_3b8 != (undefined1  [8])local_3a8) {
    operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
  std::ostream::_M_insert<double>((((TwoCaps *)argv)->super_Parameterization).radius);
  Parameterization::GetName_abi_cxx11_(&local_3d8,(Parameterization *)argv);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x1060bf);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_3e8 = *plVar7;
    lStack_3e0 = plVar5[3];
    local_3f8 = &local_3e8;
  }
  else {
    local_3e8 = *plVar7;
    local_3f8 = (long *)*plVar5;
  }
  local_3f0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3f8);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_448 = *puVar8;
    lStack_440 = plVar5[3];
    local_458 = &local_448;
  }
  else {
    local_448 = *puVar8;
    local_458 = (ulong *)*plVar5;
  }
  local_450 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar11 = 0xf;
  if (local_458 != &local_448) {
    uVar11 = local_448;
  }
  if (uVar11 < (ulong)(local_430 + local_450)) {
    uVar11 = 0xf;
    if (local_438 != local_428) {
      uVar11 = local_428[0];
    }
    if ((ulong)(local_430 + local_450) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,(ulong)local_458);
      goto LAB_001037f3;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_458,(ulong)local_438);
LAB_001037f3:
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar1) {
    local_3a8[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_3a8[0]._8_8_ = puVar6[3];
    local_3b8 = (undefined1  [8])local_3a8;
  }
  else {
    local_3a8[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_3b8 = (undefined1  [8])*puVar6;
  }
  local_3b0 = puVar6[1];
  *puVar6 = paVar1;
  puVar6[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  plVar5 = (long *)std::__cxx11::string::append(local_3b8);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_408 = *plVar7;
    lStack_400 = plVar5[3];
    local_418 = &local_408;
  }
  else {
    local_408 = *plVar7;
    local_418 = (long *)*plVar5;
  }
  local_410 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_3b8 != (undefined1  [8])local_3a8) {
    operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
  }
  if (local_438 != local_428) {
    operator_delete(local_438,local_428[0] + 1);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458,local_448 + 1);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,local_3e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_3b8);
  std::ofstream::open((string *)local_3b8,(_Ios_Openmode)&local_418);
  (*(((TwoCaps *)argv)->super_Parameterization)._vptr_Parameterization[1])(argv,local_3b8);
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n>>> SphereSurface Mesh File Complete <<<\n",0x2a);
  local_3b8 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_3b8 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&local_3b0);
  std::ios_base::~ios_base(local_2c0);
  if (local_418 != &local_408) {
    operator_delete(local_418,local_408 + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  Parameterization* param;
  double radius = 0.5e0;
  int coordinates = SPHERICAL;
  int c;

  // Parsing command line arguments with getopt
  while ((c = getopt(argc, argv, "r:p:")) != -1) {
    switch (c) {
      case 'r':
        radius = strtod(optarg, NULL);
        break;
      case 'p':
        coordinates = atoi(optarg);
        break;
      case '?':
        if (optopt == 'c')
          cout << "Option -" << optopt << " requires an argument." << endl;
        else if (isprint (optopt))
          cout << "Unknown option -" << optopt << endl;
        else
          cout << "Unknown option character " << optopt << endl;
        return 1;
      default:
        abort();
    }
  }

  switch (coordinates) {
    case RECTANGULAR:
      param = new Rectangular(radius);
      break;
    case SPHERICAL:
      param = new Spherical(radius);
      break;
    case BOX_PROJECTION:
      param = new BoxProjection(radius);
      break;
    case YIN_YANG:
      param = new YinYang(radius);
      break;
    case TWO_CAPS:
      param = new TwoCaps(radius);
      break;
  }

  // Initial log to console.
  cout << ">>> Starting SphereSurface <<<\n";
  cout << "Sphere Radius = " << param->radius << endl;
  cout << "Using Parameterization = " << param->GetName() << endl;


  // Open file to write.
  stringstream ss;
  ss << fixed << setprecision(2) << param->radius;
  string fileName = "SphereSurf-" + param->GetName() + "-r" + ss.str() + ".xyz";
  ofstream outfile;
  outfile.open(fileName);

  param->PrintPlot3D(outfile);

  outfile.close();

  cout << "\n>>> SphereSurface Mesh File Complete <<<\n";

  return 0;
}